

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

int tcu::measurePixelDiffAccuracy
              (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference,
              ConstPixelBufferAccess *result,int bestScoreDiff,int worstScoreDiff,
              CompareLogMode logMode)

{
  bool bVar1;
  int iVar2;
  int height;
  deInt32 a;
  TextureFormat *pTVar3;
  TestLog *pTVar4;
  float fVar5;
  bool local_7d2;
  allocator<char> local_781;
  string local_780;
  allocator<char> local_759;
  string local_758;
  allocator<char> local_731;
  string local_730;
  LogNumber<long> local_710;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  LogNumber<long> local_628;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  LogImage local_568;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  LogImageSet local_488;
  TextureFormat local_448;
  ConstPixelBufferAccess local_440;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  LogImage local_3c8;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  LogImage local_2e8;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  LogImage local_208;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  LogImageSet local_128;
  TextureFormat local_e8;
  TextureFormat local_e0;
  undefined1 local_d8 [8];
  Vec4 pixelScale;
  Vec4 pixelBias;
  int failThreshold;
  int score;
  float sum;
  PixelBufferAccess local_a0;
  deInt64 local_78;
  deInt64 squaredSum;
  int diffFactor;
  undefined1 local_60 [8];
  TextureLevel diffMask;
  int bestScoreDiff_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  diffMask.m_data.m_cap._4_4_ = bestScoreDiff;
  TextureFormat::TextureFormat((TextureFormat *)&stack0xffffffffffffff98,RGB,UNORM_INT8);
  iVar2 = ConstPixelBufferAccess::getWidth(reference);
  height = ConstPixelBufferAccess::getHeight(reference);
  TextureLevel::TextureLevel
            ((TextureLevel *)local_60,(TextureFormat *)&stack0xffffffffffffff98,iVar2,height,1);
  squaredSum._4_4_ = 8;
  TextureLevel::getAccess(&local_a0,(TextureLevel *)local_60);
  local_78 = computeSquaredDiffSum(reference,result,&local_a0,squaredSum._4_4_);
  fVar5 = deFloatSqrt((float)local_78);
  fVar5 = de::max<float>(fVar5 - (float)diffMask.m_data.m_cap._4_4_,0.0);
  a = deFloorFloatToInt32(100.0 - (fVar5 / (float)(worstScoreDiff - diffMask.m_data.m_cap._4_4_)) *
                                  100.0);
  iVar2 = deClamp32(a,0,100);
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelScale.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)local_d8,1.0,1.0,1.0,1.0);
  if ((logMode == COMPARE_LOG_EVERYTHING) || (iVar2 < 0xb)) {
    pTVar3 = ConstPixelBufferAccess::getFormat(result);
    TextureFormat::TextureFormat(&local_e0,RGBA,UNORM_INT8);
    bVar1 = TextureFormat::operator!=(pTVar3,&local_e0);
    local_7d2 = false;
    if (bVar1) {
      pTVar3 = ConstPixelBufferAccess::getFormat(reference);
      TextureFormat::TextureFormat(&local_e8,RGBA,UNORM_INT8);
      local_7d2 = TextureFormat::operator!=(pTVar3,&local_e8);
    }
    if (local_7d2 != false) {
      anon_unknown_47::computeScaleAndBias
                (reference,result,(Vec4 *)local_d8,(Vec4 *)(pixelScale.m_data + 2));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,imageSetName,&local_149)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,imageSetDesc,&local_171)
    ;
    LogImageSet::LogImageSet(&local_128,&local_148,&local_170);
    pTVar4 = TestLog::operator<<(log,&local_128);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"Result",&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Result",&local_251);
    LogImage::LogImage(&local_208,&local_228,&local_250,result,(Vec4 *)local_d8,
                       (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = TestLog::operator<<(pTVar4,&local_208);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Reference",&local_309);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"Reference",&local_331);
    LogImage::LogImage(&local_2e8,&local_308,&local_330,reference,(Vec4 *)local_d8,
                       (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = TestLog::operator<<(pTVar4,&local_2e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"DiffMask",&local_3e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"Difference",&local_411)
    ;
    ConstPixelBufferAccess::ConstPixelBufferAccess(&local_440,(TextureLevel *)local_60);
    LogImage::LogImage(&local_3c8,&local_3e8,&local_410,&local_440,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = TestLog::operator<<(pTVar4,&local_3c8);
    TestLog::operator<<(pTVar4,(EndImageSetToken *)&TestLog::EndImageSet);
    LogImage::~LogImage(&local_3c8);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    LogImage::~LogImage(&local_2e8);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator(&local_331);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
    LogImage::~LogImage(&local_208);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    LogImageSet::~LogImageSet(&local_128);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  else if (logMode == COMPARE_LOG_RESULT) {
    pTVar3 = ConstPixelBufferAccess::getFormat(result);
    TextureFormat::TextureFormat(&local_448,RGBA,UNORM_INT8);
    bVar1 = TextureFormat::operator!=(pTVar3,&local_448);
    if (bVar1) {
      computePixelScaleBias(result,(Vec4 *)local_d8,(Vec4 *)(pixelScale.m_data + 2));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,imageSetName,&local_4a9)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,imageSetDesc,&local_4d1)
    ;
    LogImageSet::LogImageSet(&local_488,&local_4a8,&local_4d0);
    pTVar4 = TestLog::operator<<(log,&local_488);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"Result",&local_589);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"Result",&local_5b1);
    LogImage::LogImage(&local_568,&local_588,&local_5b0,result,(Vec4 *)local_d8,
                       (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = TestLog::operator<<(pTVar4,&local_568);
    TestLog::operator<<(pTVar4,(EndImageSetToken *)&TestLog::EndImageSet);
    LogImage::~LogImage(&local_568);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator(&local_5b1);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator(&local_589);
    LogImageSet::~LogImageSet(&local_488);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
  }
  if ((logMode != COMPARE_LOG_ON_ERROR) || (iVar2 < 0xb)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"DiffSum",&local_649);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,"Squared difference sum",&local_671);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"",&local_699);
    LogNumber<long>::LogNumber(&local_628,&local_648,&local_670,&local_698,QP_KEY_TAG_NONE,local_78)
    ;
    pTVar4 = TestLog::operator<<(log,&local_628);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"Score",&local_731);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"Score",&local_759);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"",&local_781);
    LogNumber<long>::LogNumber
              (&local_710,&local_730,&local_758,&local_780,QP_KEY_TAG_QUALITY,(long)iVar2);
    TestLog::operator<<(pTVar4,&local_710);
    LogNumber<long>::~LogNumber(&local_710);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator(&local_781);
    std::__cxx11::string::~string((string *)&local_758);
    std::allocator<char>::~allocator(&local_759);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator(&local_731);
    LogNumber<long>::~LogNumber(&local_628);
    std::__cxx11::string::~string((string *)&local_698);
    std::allocator<char>::~allocator(&local_699);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator(&local_671);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
  }
  TextureLevel::~TextureLevel((TextureLevel *)local_60);
  return iVar2;
}

Assistant:

int measurePixelDiffAccuracy (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, int bestScoreDiff, int worstScoreDiff, CompareLogMode logMode)
{
	TextureLevel	diffMask		(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), reference.getWidth(), reference.getHeight());
	int				diffFactor		= 8;
	deInt64			squaredSum		= computeSquaredDiffSum(reference, result, diffMask.getAccess(), diffFactor);
	float			sum				= deFloatSqrt((float)squaredSum);
	int				score			= deClamp32(deFloorFloatToInt32(100.0f - (de::max(sum-(float)bestScoreDiff, 0.0f) / (float)(worstScoreDiff-bestScoreDiff))*100.0f), 0, 100);
	const int		failThreshold	= 10;
	Vec4			pixelBias		(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4			pixelScale		(1.0f, 1.0f, 1.0f, 1.0f);

	if (logMode == COMPARE_LOG_EVERYTHING || score <= failThreshold)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8) && reference.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computeScaleAndBias(reference, result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",			result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",		reference,	pixelScale, pixelBias)
			<< TestLog::Image("DiffMask",	"Difference",		diffMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",			result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	if (logMode != COMPARE_LOG_ON_ERROR || score <= failThreshold)
		log << TestLog::Integer("DiffSum", "Squared difference sum", "", QP_KEY_TAG_NONE, squaredSum)
			<< TestLog::Integer("Score", "Score", "", QP_KEY_TAG_QUALITY, score);

	return score;
}